

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O3

void __thiscall
duckdb::SegmentTree<duckdb::ColumnSegment,_false>::AppendSegmentInternal
          (SegmentTree<duckdb::ColumnSegment,_false> *this,SegmentLock *l,
          unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
          *segment)

{
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var1;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> uVar2;
  reference pvVar3;
  pointer pCVar4;
  pointer pSVar5;
  pointer pSVar6;
  SegmentNode<duckdb::ColumnSegment> local_38;
  
  pSVar5 = (this->nodes).
           super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = pSVar5;
  if (pSVar5 != (this->nodes).
                super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                .
                super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    _Var1._M_head_impl =
         (segment->
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
    pvVar3 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::back(&this->nodes);
    pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&pvVar3->node);
    LOCK();
    (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p = _Var1._M_head_impl;
    UNLOCK();
    pSVar5 = (this->nodes).
             super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
             .
             super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = (this->nodes).
             super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
             .
             super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_38.node.super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
  ._M_t.super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)
       (__uniq_ptr_data<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true,_true>
        )0x0;
  pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(segment);
  (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).index = (long)pSVar6 - (long)pSVar5 >> 4;
  pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(segment);
  LOCK();
  (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(segment);
  local_38.row_start = (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).start;
  local_38.node.super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
  ._M_t.super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)
       (segment->
       super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
       super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  (segment->super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>).
  _M_t.super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  ::std::
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>>>
  ::emplace_back<duckdb::SegmentNode<duckdb::ColumnSegment>>
            ((vector<duckdb::SegmentNode<duckdb::ColumnSegment>,std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>>>
              *)&this->nodes,&local_38);
  uVar2.super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)
       (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)local_38.node
  ;
  if ((_Head_base<0UL,_duckdb::ColumnSegment_*,_false>)
      local_38.node.
      super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
      super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
      super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl !=
      (_Head_base<0UL,_duckdb::ColumnSegment_*,_false>)0x0) {
    ColumnSegment::~ColumnSegment
              ((ColumnSegment *)
               local_38.node.
               super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
               .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl);
    operator_delete((void *)uVar2.
                            super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
                            .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void AppendSegmentInternal(SegmentLock &l, unique_ptr<T> segment) {
		D_ASSERT(segment);
		// add the node to the list of nodes
		if (!nodes.empty()) {
			nodes.back().node->next = segment.get();
		}
		SegmentNode<T> node;
		segment->index = nodes.size();
		segment->next = nullptr;
		node.row_start = segment->start;
		node.node = std::move(segment);
		nodes.push_back(std::move(node));
	}